

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O0

void __thiscall spdlog::details::async_msg::async_msg(async_msg *this,async_msg_type the_type)

{
  shared_ptr<spdlog::async_logger> *in_RDI;
  nullptr_t in_stack_ffffffffffffffb8;
  async_logger_ptr *worker;
  async_msg *in_stack_ffffffffffffffd0;
  async_logger_ptr local_20 [2];
  
  worker = local_20;
  std::shared_ptr<spdlog::async_logger>::shared_ptr(in_RDI,in_stack_ffffffffffffffb8);
  async_msg(in_stack_ffffffffffffffd0,worker,(async_msg_type)((ulong)in_RDI >> 0x20));
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x6f8c69);
  return;
}

Assistant:

explicit async_msg(async_msg_type the_type)
        : async_msg{nullptr, the_type} {}